

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

Population * __thiscall
Population::selection(Population *__return_storage_ptr__,Population *this,int generation)

{
  ulong uVar1;
  size_type sVar2;
  reference __x;
  undefined1 auVar3 [16];
  vector<Chromosome,_std::allocator<Chromosome>_> local_88;
  int local_70;
  int position;
  result_type local_60;
  double number;
  undefined1 local_50 [4];
  int i;
  vector<Chromosome,_std::allocator<Chromosome>_> new_chromosomes;
  exponential_distribution<double> distribution;
  float ex;
  default_random_engine generator;
  int generation_local;
  Population *this_local;
  
  generator._M_x._4_4_ = generation;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &stack0xffffffffffffffd8);
  std::exponential_distribution<double>::exponential_distribution
            ((exponential_distribution<double> *)
             &new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (double)((float)generator._M_x._4_4_ / 300.0 + 0.5));
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector
            ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_50);
  number._4_4_ = 0;
  while (uVar1 = (ulong)number._4_4_,
        sVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes),
        uVar1 < sVar2) {
    local_60 = std::exponential_distribution<double>::operator()
                         ((exponential_distribution<double> *)
                          &new_chromosomes.
                           super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &stack0xffffffffffffffd8);
    if (local_60 < 1.0) {
      number._4_4_ = number._4_4_ + 1;
      sVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes);
      auVar3._8_4_ = (int)(sVar2 >> 0x20);
      auVar3._0_8_ = sVar2;
      auVar3._12_4_ = 0x45300000;
      local_70 = (int)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * local_60);
      __x = std::vector<Chromosome,_std::allocator<Chromosome>_>::at
                      (&this->chromosomes,(long)local_70);
      std::vector<Chromosome,_std::allocator<Chromosome>_>::push_back
                ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_50,__x);
    }
  }
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector
            (&local_88,(vector<Chromosome,_std::allocator<Chromosome>_> *)local_50);
  Population(__return_storage_ptr__,&local_88);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_88);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector
            ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Population Population::selection(int generation) {

    std::default_random_engine generator;

    float ex = (float) (0.5 + (generation / 300.0));
    std::exponential_distribution<double> distribution(ex);

    std::vector<Chromosome> new_chromosomes;

    for(int i = 0; i < chromosomes.size();){
        double number = distribution(generator);
        if (number<1.0){
            i++;
            int position = int(chromosomes.size()*number);
            new_chromosomes.push_back(chromosomes.at(position));
        }
    }

    return Population(new_chromosomes);
}